

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo_approach.cpp
# Opt level: O3

vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *
histogram_approach(vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                   *__return_storage_ptr__,Mat *img)

{
  pointer *ppaVar1;
  ulong uVar2;
  pointer plVar3;
  ulong uVar4;
  size_t sVar5;
  pointer plVar6;
  size_t sVar7;
  pointer plVar8;
  size_t sVar9;
  pointer plVar10;
  long lVar11;
  iterator iVar12;
  pointer plVar13;
  long lVar14;
  size_t sVar15;
  pointer plVar16;
  size_t sVar17;
  ulong uVar18;
  size_type sVar19;
  size_type sVar20;
  int iVar21;
  bool bVar22;
  vector<line_bound,_std::allocator<line_bound>_> horz_histo;
  pointer local_b8;
  pointer plStack_b0;
  Size local_a8;
  Range local_a0;
  array<int,_4UL> local_98;
  long local_88 [10];
  Range local_38;
  
  local_98._M_elems._0_8_ = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"img","");
  cv::namedWindow((string *)&local_98,0);
  if ((long *)local_98._M_elems._0_8_ != local_88) {
    operator_delete((void *)local_98._M_elems._0_8_,local_88[0] + 1);
  }
  local_98._M_elems._0_8_ = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"img","");
  local_a8.width = 0;
  local_a8.height = 0;
  local_b8 = (pointer)CONCAT44(local_b8._4_4_,0x1010000);
  plStack_b0 = (pointer)img;
  cv::imshow((string *)&local_98,(_InputArray *)&local_b8);
  if ((long *)local_98._M_elems._0_8_ != local_88) {
    operator_delete((void *)local_98._M_elems._0_8_,local_88[0] + 1);
  }
  cv::waitKey(0);
  cv::destroyAllWindows();
  iVar21 = *(int *)(img + 8);
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.width = 0;
  local_a8.height = 0;
  local_b8 = (pointer)0x0;
  plStack_b0 = (pointer)0x0;
  std::vector<line_bound,_std::allocator<line_bound>_>::resize
            ((vector<line_bound,_std::allocator<line_bound>_> *)&local_b8,(long)iVar21);
  if (0 < iVar21) {
    sVar19 = 0;
    do {
      sVar20 = sVar19 + 1;
      local_a0.start = (int)sVar19;
      local_a0.end = (int)sVar20;
      local_38.start = -0x80000000;
      local_38.end = 0x7fffffff;
      cv::Mat::Mat((Mat *)&local_98,img,&local_a0,&local_38);
      sVar7 = (size_t)local_98._M_elems[3];
      if (sVar7 == 0) {
        uVar4 = 0;
        sVar5 = 0;
        sVar9 = 0;
      }
      else {
        sVar5 = 0;
        uVar4 = 0;
        sVar17 = 0;
        sVar15 = 0;
        uVar18 = 0;
        sVar9 = 0;
        do {
          if (*(char *)(local_88[0] + sVar17) == '\0') {
            if (uVar4 < uVar18) {
              uVar4 = uVar18;
              sVar5 = sVar17;
              sVar9 = sVar15;
            }
            uVar18 = 0;
            sVar15 = 0;
          }
          else {
            bVar22 = uVar18 == 0;
            uVar18 = uVar18 + 1;
            if (bVar22) {
              sVar15 = sVar17;
            }
          }
          sVar17 = sVar17 + 1;
        } while (sVar7 != sVar17);
        if (uVar4 < uVar18) {
          uVar4 = uVar18;
          sVar5 = sVar7;
          sVar9 = sVar15;
        }
      }
      local_b8[sVar19].ibegin = sVar9;
      local_b8[sVar19].iend = sVar5;
      local_b8[sVar19].size = uVar4;
      cv::Mat::~Mat((Mat *)&local_98);
      sVar19 = sVar20;
    } while (sVar20 != (long)iVar21);
  }
  plVar3 = local_b8;
  plVar6 = local_b8;
  if ((local_b8 != plStack_b0) && (plVar10 = local_b8 + 1, plVar10 != plStack_b0)) {
    plVar6 = plVar10;
    if (local_b8[1].size < local_b8->size) {
      plVar6 = local_b8;
    }
    plVar8 = local_b8 + 2;
    if (plVar8 != plStack_b0) {
      if (local_b8->size <= local_b8[1].size) {
        plVar10 = local_b8;
      }
      do {
        plVar13 = plVar8 + 1;
        if (plVar13 == plStack_b0) {
          if ((plVar10->size <= plVar8->size) && (plVar6->size <= plVar8->size)) {
            plVar6 = plVar8;
          }
          break;
        }
        uVar4 = plVar8->size;
        uVar18 = plVar8[1].size;
        bVar22 = uVar18 < uVar4;
        plVar16 = plVar8;
        uVar2 = uVar4;
        if (bVar22) {
          plVar16 = plVar13;
          uVar2 = uVar18;
        }
        if (!bVar22 && uVar18 != uVar4) {
          uVar4 = uVar18;
        }
        if (bVar22) {
          plVar13 = plVar8;
        }
        if (plVar10->size <= uVar2) {
          plVar16 = plVar10;
        }
        plVar10 = plVar16;
        if (plVar6->size <= uVar4) {
          plVar6 = plVar13;
        }
        plVar8 = plVar8 + 2;
      } while (plVar8 != plStack_b0);
    }
  }
  uVar4 = plVar6->size;
  lVar14 = (long)plStack_b0 - (long)local_b8;
  lVar11 = (lVar14 >> 3) * -0x5555555555555555 >> 2;
  plVar6 = local_b8;
  if (0 < lVar11) {
    plVar6 = local_b8 + lVar11 * 4;
    lVar11 = lVar11 + 1;
    plVar10 = local_b8 + 2;
    do {
      if (uVar4 <= plVar10[-2].size) {
        plVar10 = plVar10 + -2;
        goto LAB_00111a20;
      }
      if (uVar4 <= plVar10[-1].size) {
        plVar10 = plVar10 + -1;
        goto LAB_00111a20;
      }
      if (uVar4 <= plVar10->size) goto LAB_00111a20;
      if (uVar4 <= plVar10[1].size) {
        plVar10 = plVar10 + 1;
        goto LAB_00111a20;
      }
      lVar11 = lVar11 + -1;
      plVar10 = plVar10 + 4;
    } while (1 < lVar11);
    lVar14 = (long)plStack_b0 - (long)plVar6;
  }
  lVar11 = (lVar14 >> 3) * -0x5555555555555555;
  if (lVar11 != 1) {
    if (lVar11 != 2) {
      plVar10 = plStack_b0;
      if ((lVar11 != 3) || (plVar10 = plVar6, uVar4 <= plVar6->size)) goto LAB_00111a20;
      plVar6 = plVar6 + 1;
    }
    plVar10 = plVar6;
    if (uVar4 <= plVar6->size) goto LAB_00111a20;
    plVar6 = plVar6 + 1;
  }
  plVar10 = plStack_b0;
  if (uVar4 <= plVar6->size) {
    plVar10 = plVar6;
  }
LAB_00111a20:
  plVar10->ibegin = 0;
  local_98._M_elems[0] = 0;
  local_98._M_elems[1] = 0;
  local_98._M_elems[2] = (int)plVar10->iend;
  local_98._M_elems[3] = 0;
  std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>::
  _M_realloc_insert<std::array<int,4ul>>
            ((vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>> *)
             __return_storage_ptr__,(iterator)0x0,&local_98);
  iVar12._M_current =
       (__return_storage_ptr__->
       super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  iVar21 = (int)uVar4 + (int)((ulong)((long)plVar10 - (long)plVar3) >> 3) * -0x55555555;
  local_98._M_elems[2] = (int)plVar10->ibegin;
  local_98._M_elems[1] = 0;
  local_98._M_elems[0] = local_98._M_elems[2];
  if (iVar12._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_98._M_elems[3] = iVar21;
    std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>::
    _M_realloc_insert<std::array<int,4ul>>
              ((vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>> *)
               __return_storage_ptr__,iVar12,&local_98);
    iVar12._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *(undefined8 *)(iVar12._M_current)->_M_elems = local_98._M_elems._0_8_;
    *(ulong *)((iVar12._M_current)->_M_elems + 2) = CONCAT44(iVar21,local_98._M_elems[2]);
    iVar12._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (__return_storage_ptr__->
    super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar12._M_current;
  }
  local_98._M_elems[2] = (int)plVar10->iend;
  local_98._M_elems[1] = 0;
  local_98._M_elems[0] = local_98._M_elems[2];
  if (iVar12._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_98._M_elems[3] = iVar21;
    std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>::
    _M_realloc_insert<std::array<int,4ul>>
              ((vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>> *)
               __return_storage_ptr__,iVar12,&local_98);
    iVar12._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *(undefined8 *)(iVar12._M_current)->_M_elems = local_98._M_elems._0_8_;
    *(ulong *)((iVar12._M_current)->_M_elems + 2) = CONCAT44(iVar21,local_98._M_elems[2]);
    iVar12._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (__return_storage_ptr__->
    super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar12._M_current;
  }
  local_98._M_elems[1] = iVar21;
  local_98._M_elems[0] = (int)plVar10->ibegin;
  local_98._M_elems[2] = (int)plVar10->iend;
  if (iVar12._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_98._M_elems[3] = iVar21;
    std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>::
    _M_realloc_insert<std::array<int,4ul>>
              ((vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>> *)
               __return_storage_ptr__,iVar12,&local_98);
  }
  else {
    *(undefined8 *)(iVar12._M_current)->_M_elems = local_98._M_elems._0_8_;
    *(ulong *)((iVar12._M_current)->_M_elems + 2) = CONCAT44(iVar21,local_98._M_elems[2]);
    ppaVar1 = &(__return_storage_ptr__->
               super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
    local_98._M_elems[3] = iVar21;
  }
  if (local_b8 != (pointer)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::array<int, 4>> histogram_approach(const cv::Mat& img)
{
    cv::namedWindow("img", cv::WINDOW_NORMAL);
    cv::imshow("img", img);
    cv::waitKey(0);
    cv::destroyAllWindows();

    const int row_size = img.rows;
    std::vector<std::array<int, 4>> result;

    std::vector<line_bound> horz_histo;
    horz_histo.resize(row_size);

    for(int i = 0; i < row_size; i++)
    {
        horz_histo[i] = find_longest_line(img.row(i));
    }

    auto minmax = std::minmax_element(horz_histo.begin(), horz_histo.end(),
        [](const line_bound& lval, const line_bound& rval) { return lval.size < rval.size; });

    auto upper_threshold = minmax.second->size;

    auto upper_b = std::find_if(horz_histo.begin(), horz_histo.end(),
        [upper_threshold](const line_bound& v) { return v.size >= upper_threshold; });

    std::size_t upper_i = std::distance(horz_histo.begin(), upper_b);
    std::size_t lower_i = upper_i + minmax.second->size;
    upper_i *= static_cast<std::size_t>(0.95);
    lower_i *= static_cast<std::size_t>(1.05);
    upper_b->ibegin *= static_cast<std::size_t>(0.95);
    upper_b->iend *= static_cast<std::size_t>(1.05);

    result.push_back({int(upper_b->ibegin), int(upper_i), int(upper_b->iend), int(upper_i)});
    result.push_back({int(upper_b->ibegin), int(upper_i), int(upper_b->ibegin), int(lower_i)});
    result.push_back({int(upper_b->iend), int(upper_i), int(upper_b->iend), int(lower_i)});
    result.push_back({int(upper_b->ibegin), int(lower_i), int(upper_b->iend), int(lower_i)});

    return result;
}